

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::RefineF0Candidates
               (double *x,int x_length,double fs,double *temporal_positions,int f0_length,
               int max_candidates,double f0_floor,double f0_ceil,double **refined_f0_candidates,
               double **f0_scores)

{
  int in_ECX;
  double *in_RDX;
  undefined4 in_ESI;
  double in_RDI;
  int in_R8D;
  double *in_XMM0_Qa;
  int j;
  int i;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 in_stack_fffffffffffffff0;
  
  for (local_44 = 0; local_44 < in_ECX; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
      GetRefinedF0((double *)CONCAT44(f0_length,max_candidates),f0_floor._4_4_,f0_ceil,
                   (double)refined_f0_candidates,_j,in_RDI,
                   (double)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_XMM0_Qa,in_RDX);
    }
  }
  return;
}

Assistant:

static void RefineF0Candidates(const double *x, int x_length, double fs,
    const double *temporal_positions, int f0_length, int max_candidates,
    double f0_floor, double f0_ceil,
    double **refined_f0_candidates, double **f0_scores) {
  for (int i = 0; i < f0_length; i++)
    for (int j = 0; j < max_candidates; ++j)
      GetRefinedF0(x, x_length, fs, temporal_positions[i],
          refined_f0_candidates[i][j], f0_floor, f0_ceil,
          &refined_f0_candidates[i][j], &f0_scores[i][j]);
}